

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O0

void huelang::__instate_flag(Environment *env)

{
  unsigned_long uVar1;
  bool bVar2;
  reference pvVar3;
  ostream *this;
  Word word_00;
  undefined1 local_48 [8];
  string name;
  Word word;
  Environment *env_local;
  
  bVar2 = std::stack<huelang::Word,_std::deque<huelang::Word,_std::allocator<huelang::Word>_>_>::
          empty(&(env->executionStack).
                 super_stack<huelang::Word,_std::deque<huelang::Word,_std::allocator<huelang::Word>_>_>
               );
  if (!bVar2) {
    pvVar3 = std::stack<huelang::Word,_std::deque<huelang::Word,_std::allocator<huelang::Word>_>_>::
             top(&(env->executionStack).
                  super_stack<huelang::Word,_std::deque<huelang::Word,_std::allocator<huelang::Word>_>_>
                );
    name.field_2._8_8_ = *(undefined8 *)pvVar3;
    uVar1 = pvVar3->minor;
    std::stack<huelang::Word,_std::deque<huelang::Word,_std::allocator<huelang::Word>_>_>::pop
              (&(env->executionStack).
                super_stack<huelang::Word,_std::deque<huelang::Word,_std::allocator<huelang::Word>_>_>
              );
    word_00._0_8_ = name.field_2._8_8_ & 0xffffffff;
    word_00.minor = uVar1;
    DefinitionTable::GetName_abi_cxx11_((string *)local_48,&env->definitionTable,word_00);
    this = std::operator<<((ostream *)&std::cout,"Internal state");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void __instate_flag(Environment& env) {
        if (env.executionStack.empty()) return;
        Word word = env.executionStack.top();
        env.executionStack.pop();
        string name = env.definitionTable.GetName(word);
        cout << "Internal state" << endl;
    }